

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O2

void test_linear_hash_get
               (planck_unit_test_t *tc,ion_key_t key,ion_err_t expected_status,
               ion_result_count_t expected_count,ion_value_t expected_value,
               linear_hash_table_t *linear_hash)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  ion_byte_t *key_00;
  planck_unit_test_t *state;
  ion_value_t __s1;
  int32_t expected;
  ion_result_count_t expected_00;
  planck_unit_result_t pVar4;
  int actual;
  ion_status_t iVar5;
  int line;
  undefined7 in_register_00000011;
  size_t sVar6;
  ion_byte_t *piVar7;
  ion_byte_t *piVar8;
  ion_byte_t *__s;
  ion_byte_t *value;
  ulong uVar9;
  ion_byte_t aiStack_60 [8];
  ion_byte_t aiStack_58 [8];
  ion_byte_t *local_50;
  planck_unit_test_t *local_48;
  ion_value_t local_40;
  int32_t local_38;
  ion_result_count_t local_34;
  
  local_40 = expected_value;
  local_34 = expected_count;
  local_38 = (int32_t)CONCAT71(in_register_00000011,expected_status);
  local_50 = (ion_byte_t *)key;
  local_48 = tc;
  sVar6 = (size_t)(linear_hash->super).record.value_size;
  uVar9 = sVar6 + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar9;
  __s = aiStack_58 + lVar2;
  piVar7 = aiStack_60 + lVar2;
  piVar7[0] = 'v';
  piVar7[1] = '\0';
  piVar7[2] = '\0';
  piVar7[3] = '\0';
  piVar7[4] = '\0';
  piVar7[5] = '\0';
  piVar7[6] = '\0';
  piVar7[7] = '\0';
  uVar1 = *(undefined8 *)(aiStack_60 + lVar2);
  piVar8 = aiStack_60 + lVar2;
  piVar8[0] = 0xc1;
  piVar8[1] = '\x14';
  piVar8[2] = '\x10';
  piVar8[3] = '\0';
  piVar8[4] = '\0';
  piVar8[5] = '\0';
  piVar8[6] = '\0';
  piVar8[7] = '\0';
  memset(__s,(int)uVar1,sVar6);
  lVar3 = -uVar9;
  value = __s + lVar3;
  value[-8] = 'v';
  state = local_48;
  value[-7] = '\0';
  value[-6] = '\0';
  value[-5] = '\0';
  value[-4] = '\0';
  value[-3] = '\0';
  value[-2] = '\0';
  value[-1] = '\0';
  uVar1 = *(undefined8 *)(value + -8);
  value[-8] = 0xdf;
  value[-7] = '\x14';
  value[-6] = '\x10';
  value[-5] = '\0';
  value[-4] = '\0';
  value[-3] = '\0';
  value[-2] = '\0';
  value[-1] = '\0';
  memset(value,(int)uVar1,sVar6);
  key_00 = local_50;
  value[-8] = 0xee;
  value[-7] = '\x14';
  value[-6] = '\x10';
  value[-5] = '\0';
  value[-4] = '\0';
  value[-3] = '\0';
  value[-2] = '\0';
  value[-1] = '\0';
  iVar5 = linear_hash_get(key_00,value,linear_hash);
  value[-8] = '\x7f';
  expected = local_38;
  value[-7] = '\0';
  value[-6] = '\0';
  value[-5] = '\0';
  value[-4] = '\0';
  value[-3] = '\0';
  value[-2] = '\0';
  value[-1] = '\0';
  builtin_memcpy(aiStack_58 + lVar3 + lVar2 + -8,"\n\x15\x10",4);
  value[-4] = '\0';
  value[-3] = '\0';
  value[-2] = '\0';
  value[-1] = '\0';
  pVar4 = planck_unit_assert_int_are_equal
                    (state,expected,(int)iVar5.error,(int)*(undefined8 *)(value + -8),
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                    );
  expected_00 = local_34;
  if (pVar4 != '\0') {
    builtin_memcpy(aiStack_58 + lVar3 + lVar2 + -8,"0\x15\x10",4);
    value[-4] = '\0';
    value[-3] = '\0';
    value[-2] = '\0';
    value[-1] = '\0';
    pVar4 = planck_unit_assert_int_are_equal
                      (state,expected_00,iVar5.count,0x80,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                      );
    __s1 = local_40;
    if (pVar4 != '\0') {
      sVar6 = (size_t)(linear_hash->super).record.value_size;
      if (((ulong)iVar5 & 0xff) == 0) {
        builtin_memcpy(aiStack_58 + lVar3 + lVar2 + -8,"j\x15\x10",4);
        value[-4] = '\0';
        value[-3] = '\0';
        value[-2] = '\0';
        value[-1] = '\0';
        actual = memcmp(__s1,value,sVar6);
        line = 0x83;
      }
      else {
        builtin_memcpy(aiStack_58 + lVar3 + lVar2 + -8,"I\x15\x10",4);
        value[-4] = '\0';
        value[-3] = '\0';
        value[-2] = '\0';
        value[-1] = '\0';
        actual = memcmp(__s,value,sVar6);
        line = 0x87;
      }
      value[-8] = 0x82;
      value[-7] = '\x15';
      value[-6] = '\x10';
      value[-5] = '\0';
      value[-4] = '\0';
      value[-3] = '\0';
      value[-2] = '\0';
      value[-1] = '\0';
      pVar4 = planck_unit_assert_int_are_equal
                        (state,0,actual,line,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                        );
      if (pVar4 != '\0') {
        return;
      }
    }
  }
  value[-8] = '\x01';
  value[-7] = '\0';
  value[-6] = '\0';
  value[-5] = '\0';
  value[-4] = '\0';
  value[-3] = '\0';
  value[-2] = '\0';
  value[-1] = '\0';
  uVar1 = *(undefined8 *)(value + -8);
  *(code **)(value + -8) = test_linear_hash_insert;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,(int)uVar1);
}

Assistant:

void
test_linear_hash_get(
	planck_unit_test_t	*tc,
	ion_key_t			key,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count,
	ion_value_t			expected_value,
	linear_hash_table_t *linear_hash
) {
	ion_value_t defaultval = alloca(linear_hash->super.record.value_size);

	memset(defaultval, 0x76, linear_hash->super.record.value_size);

	ion_value_t retval = alloca(linear_hash->super.record.value_size);

	memcpy(retval, defaultval, linear_hash->super.record.value_size);

	ion_status_t status = linear_hash_get(key, retval, linear_hash);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (err_ok == status.error) {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(expected_value, retval, linear_hash->super.record.value_size));
	}
	else {
		/* Here, we check to see that the passed in space to write the value remains unchanged, if we have an error condition. */
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(defaultval, retval, linear_hash->super.record.value_size));
	}
}